

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

Message * __thiscall hrgls::Message::operator=(Message *this,Message *copy)

{
  hrgls_Status hVar1;
  Message_private *pMVar2;
  hrgls_Message phVar3;
  Message *copy_local;
  Message *this_local;
  
  if (this->m_private != (Message_private *)0x0) {
    if (this->m_private->Message != (hrgls_Message)0x0) {
      hrgls_MessageDestroy(this->m_private->Message);
    }
    if (this->m_private != (Message_private *)0x0) {
      operator_delete(this->m_private);
    }
  }
  pMVar2 = (Message_private *)operator_new(0x10);
  memset(pMVar2,0,0x10);
  Message_private::Message_private(pMVar2);
  this->m_private = pMVar2;
  pMVar2 = this->m_private;
  phVar3 = RawMessage(copy);
  hVar1 = hrgls_MessageCopy(pMVar2,phVar3);
  this->m_private->status = hVar1;
  return this;
}

Assistant:

Message &Message::operator = (const Message &copy)
  {
    if (m_private) {
      if (m_private->Message) {
        hrgls_MessageDestroy(m_private->Message);
      }
      delete m_private;
    }
    m_private = new Message_private();
    m_private->status = hrgls_MessageCopy(&m_private->Message, copy.RawMessage());
    return *this;
  }